

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O3

Vec_Ptr_t * collectBarrierDisjunctions(Aig_Man_t *pAigOld,Aig_Man_t *pAigNew,Vec_Ptr_t *vBarriers)

{
  uint uVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Aig_Obj_t *p0;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  Aig_Man_t *__ptr;
  Aig_Man_t *pAig;
  int iVar8;
  Aig_Obj_t *p1;
  ulong local_50;
  
  if (vBarriers != (Vec_Ptr_t *)0x0) {
    uVar1 = vBarriers->nSize;
    if (0 < (long)(int)uVar1) {
      pVVar3 = (Vec_Ptr_t *)malloc(0x10);
      local_50 = 8;
      if (8 < uVar1) {
        local_50 = (ulong)uVar1;
      }
      pVVar3->nSize = 0;
      pVVar3->nCap = (int)local_50;
      pAig = (Aig_Man_t *)(local_50 * 8);
      ppvVar4 = (void **)malloc((size_t)pAig);
      pVVar3->pArray = ppvVar4;
      uVar6 = 0;
      while ((long)uVar6 < (long)vBarriers->nSize) {
        pvVar2 = vBarriers->pArray[uVar6];
        if (*(int *)((long)pvVar2 + 4) < 1) {
          __assert_fail("Vec_IntSize( vIthBarrier ) >= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                        ,0x8e,
                        "Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
        p1 = (Aig_Obj_t *)((ulong)pAigNew->pConst1 ^ 1);
        lVar7 = 0;
        do {
          iVar8 = *(int *)(*(long *)((long)pvVar2 + 8) + lVar7 * 4);
          if (((long)iVar8 < 0) || (pAigOld->vCos->nSize <= iVar8)) goto LAB_005b90a6;
          p0 = driverToPoNew(pAig,(Aig_Obj_t *)pAigOld->vCos->pArray[iVar8]);
          pAig = pAigNew;
          p1 = Aig_Or(pAigNew,p0,p1);
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)((long)pvVar2 + 4));
        if (p1 == (Aig_Obj_t *)0x0) {
          __assert_fail("pObjBarrier",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                        ,0x98,
                        "Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
        iVar8 = (int)local_50;
        if ((int)uVar6 == iVar8) {
          if (iVar8 < 0x10) {
            pAig = (Aig_Man_t *)pVVar3->pArray;
            if (pAig == (Aig_Man_t *)0x0) {
              pAig = (Aig_Man_t *)0x80;
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pAig,0x80);
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = 0x10;
            local_50 = 0x10;
          }
          else {
            local_50 = (ulong)(uint)(iVar8 * 2);
            __ptr = (Aig_Man_t *)pVVar3->pArray;
            pAig = (Aig_Man_t *)(local_50 * 8);
            if (__ptr == (Aig_Man_t *)0x0) {
              ppvVar4 = (void **)malloc((size_t)pAig);
            }
            else {
              ppvVar4 = (void **)realloc(__ptr,(size_t)pAig);
              pAig = __ptr;
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = iVar8 * 2;
          }
        }
        else {
          ppvVar4 = pVVar3->pArray;
        }
        uVar5 = uVar6 + 1;
        pVVar3->nSize = (uint)uVar5;
        ppvVar4[uVar6 & 0xffffffff] = p1;
        uVar6 = uVar5;
        if (uVar5 == (long)(int)uVar1) {
          if ((uint)uVar5 == uVar1) {
            return pVVar3;
          }
          __assert_fail("Vec_PtrSize( vNewBarrierSignals ) == barrierCount",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                        ,0x9b,
                        "Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
      }
LAB_005b90a6:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *pAigOld, Aig_Man_t *pAigNew, Vec_Ptr_t *vBarriers)
{
	int barrierCount, i, j, jElem;
	Vec_Int_t *vIthBarrier;
	Aig_Obj_t *pObjBarrier, *pObjCurr, *pObjTargetPoOld;
	Vec_Ptr_t *vNewBarrierSignals;

	if( vBarriers == NULL )
		return NULL;
	barrierCount = Vec_PtrSize( vBarriers );
	if( barrierCount <= 0 )
		return NULL;

	vNewBarrierSignals = Vec_PtrAlloc( barrierCount );

	for( i=0; i<barrierCount; i++ )
	{
		vIthBarrier = (Vec_Int_t *)Vec_PtrEntry( vBarriers, i );
		assert( Vec_IntSize( vIthBarrier ) >= 1 );
		pObjBarrier = Aig_Not(Aig_ManConst1(pAigNew));
		Vec_IntForEachEntry( vIthBarrier, jElem, j )
		{
			pObjTargetPoOld = Aig_ManCo( pAigOld, jElem );
			//Aig_ObjPrint( pAigOld, pObjTargetPoOld );
			//printf("\n");
			pObjCurr = driverToPoNew( pAigOld, pObjTargetPoOld );
			pObjBarrier = Aig_Or( pAigNew, pObjCurr, pObjBarrier );
		}
		assert( pObjBarrier );
		Vec_PtrPush(vNewBarrierSignals, pObjBarrier);
	}
	assert( Vec_PtrSize( vNewBarrierSignals ) == barrierCount );

	return vNewBarrierSignals;
}